

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RangeListSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::RangeListSyntax,slang::syntax::RangeListSyntax_const&>
          (BumpAllocator *this,RangeListSyntax *args)

{
  RangeListSyntax *pRVar1;
  RangeListSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pRVar1 = (RangeListSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::RangeListSyntax::RangeListSyntax(in_RSI,pRVar1);
  return pRVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }